

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O3

int ipcmd_open_tcp(ipcmd_t *ipcmd,char *host,int port)

{
  int iVar1;
  in_addr_t iVar2;
  ipcmd_tcp_type_t iVar3;
  sockaddr local_30;
  
  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
  local_30.sa_data[10] = '\0';
  local_30.sa_data[0xb] = '\0';
  local_30.sa_data[0xc] = '\0';
  local_30.sa_data[0xd] = '\0';
  local_30.sa_data[2] = '\0';
  local_30.sa_data[3] = '\0';
  local_30.sa_data[4] = '\0';
  local_30.sa_data[5] = '\0';
  local_30.sa_data[6] = '\0';
  local_30.sa_data[7] = '\0';
  local_30.sa_data[8] = '\0';
  local_30.sa_data[9] = '\0';
  local_30.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_30.sa_family = 2;
  iVar3 = IPCMD_TCP_CLIENT;
  iVar1 = socket(2,1,0);
  ipcmd->socket = iVar1;
  memset(ipcmd->clients,0xff,0x100);
  if (host == (char *)0x0) {
    local_30.sa_data._2_8_ = local_30.sa_data._2_8_ & 0xffffffff00000000;
    bind(iVar1,&local_30,0x10);
    listen(ipcmd->socket,0x40);
    iVar3 = IPCMD_TCP_SERVER;
  }
  else {
    iVar2 = inet_addr(host);
    local_30.sa_data._2_4_ = iVar2;
    iVar1 = connect(ipcmd->socket,&local_30,0x10);
    if (iVar1 == -1) {
      return -1;
    }
  }
  ipcmd->tcp_type = iVar3;
  ipcmd->type = IPCMD_TCP;
  ipcmd->send = ipcmd_send_tcp;
  ipcmd->recv = ipcmd_recv_tcp;
  ipcmd->flush = ipcmd_flush_tcp;
  ipcmd->connection_error = 0;
  return 1;
}

Assistant:

int ipcmd_open_tcp(struct ipcmd_t* ipcmd, char* host, int port)
{
  struct sockaddr_in addr;
  int i;

#if HAVE_LIBWS2_32
  WSADATA wsadata;

  if (WSAStartup(MAKEWORD(2, 2), &wsadata) != 0)
  {
    return -1;
  }
#endif  // HAVE_LIBWS2_32

  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
  memset(&addr, 0, sizeof(addr));
  addr.sin_port = htons(port);
  addr.sin_family = AF_INET;

  ipcmd->socket = socket(AF_INET, SOCK_STREAM, 0);
  for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
  {
    ipcmd->clients[i] = -1;
  }

  if (!host)
  {
    addr.sin_addr.s_addr = htonl(INADDR_ANY);
    bind(ipcmd->socket, (struct sockaddr*)&addr, sizeof(addr));

    listen(ipcmd->socket, YPSPUR_MAX_SOCKET);
    ipcmd->tcp_type = IPCMD_TCP_SERVER;
  }
  else
  {
    addr.sin_addr.s_addr = inet_addr(host);

    if (connect(ipcmd->socket, (struct sockaddr*)&addr, sizeof(addr)) == -1)
    {
      return -1;
    }
    ipcmd->tcp_type = IPCMD_TCP_CLIENT;
  }

  ipcmd->type = IPCMD_TCP;
  ipcmd->send = ipcmd_send_tcp;
  ipcmd->recv = ipcmd_recv_tcp;
  ipcmd->flush = ipcmd_flush_tcp;

  ipcmd->connection_error = 0;

  return 1;
}